

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

void __thiscall pbrt::BDPTIntegrator::Render(BDPTIntegrator *this)

{
  Bounds2i pixelBounds;
  undefined1 uVar1;
  string *filename_00;
  Tuple2<pbrt::Point2,_int> fullResolution;
  Film *pFVar2;
  TaggedPointer *this_00;
  long in_RDI;
  Float FVar3;
  ImageMetadata metadata;
  size_t i;
  Float invSampleCount;
  FilmBaseParameters p;
  string filename;
  int t;
  int s;
  int depth;
  int bufferCount;
  ImageTileIntegrator *in_stack_00000ac8;
  RGBFilm *in_stack_fffffffffffffba8;
  ImageMetadata *in_stack_fffffffffffffbb0;
  undefined7 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbf;
  PixelSensor *in_stack_fffffffffffffbc0;
  Film *this_01;
  vector<pbrt::Film,_std::allocator<pbrt::Film>_> *in_stack_fffffffffffffbc8;
  Float diagonal;
  undefined4 in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd4;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffbd8;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe8;
  float in_stack_fffffffffffffbec;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffc08;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffc10;
  Allocator in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc73;
  Float in_stack_fffffffffffffc74;
  RGBColorSpace *in_stack_fffffffffffffc78;
  FilmBaseParameters *in_stack_fffffffffffffc80;
  RGBFilm *in_stack_fffffffffffffc88;
  Allocator in_stack_fffffffffffffc90;
  Film *local_180;
  undefined1 local_110 [76];
  Tuple2<pbrt::Point2,_int> local_c4;
  Tuple2<pbrt::Point2,_int> local_90;
  string local_38 [32];
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  if (((*(byte *)(in_RDI + 0x60) & 1) != 0) || ((*(byte *)(in_RDI + 0x61) & 1) != 0)) {
    local_c = ((*(int *)(in_RDI + 0x50) + 1) * (*(int *)(in_RDI + 0x50) + 6)) / 2;
    std::vector<pbrt::Film,_std::allocator<pbrt::Film>_>::resize
              ((vector<pbrt::Film,_std::allocator<pbrt::Film>_> *)
               CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               (size_type)in_stack_fffffffffffffbc8);
    for (local_10 = 0; local_10 <= *(int *)(in_RDI + 0x50); local_10 = local_10 + 1) {
      for (local_14 = 0; diagonal = (Float)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
          local_14 <= local_10 + 2; local_14 = local_14 + 1) {
        local_18 = (local_10 + 2) - local_14;
        if ((local_18 != 0) && ((local_14 != 1 || (local_18 != 1)))) {
          StringPrintf<int&,int&,int&>
                    ((char *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                     (int *)in_stack_fffffffffffffbe0,(int *)in_stack_fffffffffffffbd8,
                     (int *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
          Camera::GetFilm((Camera *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
          in_stack_fffffffffffffc10 =
               (Tuple2<pbrt::Point2,_int>)Film::FullResolution((Film *)in_stack_fffffffffffffba8);
          local_90 = in_stack_fffffffffffffc10;
          Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffbb0,
                              (int)((ulong)in_stack_fffffffffffffba8 >> 0x20),
                              (int)in_stack_fffffffffffffba8);
          Camera::GetFilm((Camera *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
          in_stack_fffffffffffffc08 =
               (Tuple2<pbrt::Point2,_int>)Film::FullResolution((Film *)in_stack_fffffffffffffba8);
          local_c4 = in_stack_fffffffffffffc08;
          Bounds2<int>::Bounds2
                    ((Bounds2<int> *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                     (Point2<int>)in_stack_fffffffffffffbe0,(Point2<int>)in_stack_fffffffffffffbd8);
          filename_00 = (string *)operator_new(8);
          Vector2<float>::Vector2
                    ((Vector2<float> *)in_stack_fffffffffffffbb0,
                     (float)((ulong)in_stack_fffffffffffffba8 >> 0x20),
                     SUB84(in_stack_fffffffffffffba8,0));
          BoxFilter::BoxFilter((BoxFilter *)filename_00,(Vector2f)local_110._48_8_);
          Filter::TaggedPointer<pbrt::BoxFilter>
                    ((Filter *)in_stack_fffffffffffffbb0,(BoxFilter *)in_stack_fffffffffffffba8);
          Camera::GetFilm((Camera *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
          FVar3 = Film::Diagonal((Film *)in_stack_fffffffffffffbb0);
          in_stack_fffffffffffffbec = FVar3 * 1000.0;
          pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                    ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffbb0);
          fullResolution =
               (Tuple2<pbrt::Point2,_int>)PixelSensor::CreateDefault(in_stack_fffffffffffffc40);
          std::__cxx11::string::string((string *)local_110,local_38);
          in_stack_fffffffffffffba8 = (RGBFilm *)local_110;
          pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffbe8;
          pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int> = in_stack_fffffffffffffbe0;
          pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.y = (int)in_stack_fffffffffffffbec;
          FilmBaseParameters::FilmBaseParameters
                    ((FilmBaseParameters *)in_stack_fffffffffffffbd8,(Point2i)fullResolution,
                     pixelBounds,
                     (Filter *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                     diagonal,in_stack_fffffffffffffbc0,filename_00);
          std::__cxx11::string::~string((string *)local_110);
          in_stack_fffffffffffffbe0 = (Tuple2<pbrt::Point2,_int>)operator_new(0xa8);
          FilmBaseParameters::FilmBaseParameters
                    ((FilmBaseParameters *)in_stack_fffffffffffffbb0,
                     (FilmBaseParameters *)in_stack_fffffffffffffba8);
          in_stack_fffffffffffffbd8 = RGBColorSpace::sRGB;
          pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                    ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffbb0);
          RGBFilm::RGBFilm(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
                           in_stack_fffffffffffffc78,in_stack_fffffffffffffc74,
                           (bool)in_stack_fffffffffffffc73,in_stack_fffffffffffffc90);
          Film::TaggedPointer<pbrt::RGBFilm>
                    ((Film *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
          in_stack_fffffffffffffbc8 =
               (vector<pbrt::Film,_std::allocator<pbrt::Film>_> *)(in_RDI + 0x68);
          in_stack_fffffffffffffbd4 = BufferIndex(local_14,local_18);
          std::vector<pbrt::Film,_std::allocator<pbrt::Film>_>::operator[]
                    (in_stack_fffffffffffffbc8,(long)in_stack_fffffffffffffbd4);
          Film::operator=((Film *)in_stack_fffffffffffffbb0,(Film *)in_stack_fffffffffffffba8);
          FilmBaseParameters::~FilmBaseParameters((FilmBaseParameters *)0x800828);
          FilmBaseParameters::~FilmBaseParameters((FilmBaseParameters *)0x800835);
          std::__cxx11::string::~string(local_38);
        }
      }
    }
  }
  ImageTileIntegrator::Render(in_stack_00000ac8);
  if (((*(byte *)(in_RDI + 0x60) & 1) != 0) || ((*(byte *)(in_RDI + 0x61) & 1) != 0)) {
    Sampler::SamplesPerPixel((Sampler *)in_stack_fffffffffffffbb0);
    local_180 = (Film *)0x0;
    while (this_01 = local_180,
          pFVar2 = (Film *)std::vector<pbrt::Film,_std::allocator<pbrt::Film>_>::size
                                     ((vector<pbrt::Film,_std::allocator<pbrt::Film>_> *)
                                      (in_RDI + 0x68)), this_01 < pFVar2) {
      ImageMetadata::ImageMetadata(in_stack_fffffffffffffbb0);
      this_00 = (TaggedPointer *)
                std::vector<pbrt::Film,_std::allocator<pbrt::Film>_>::operator[]
                          ((vector<pbrt::Film,_std::allocator<pbrt::Film>_> *)(in_RDI + 0x68),
                           (size_type)local_180);
      uVar1 = pbrt::TaggedPointer::operator_cast_to_bool(this_00);
      if ((bool)uVar1) {
        in_stack_fffffffffffffbb0 =
             (ImageMetadata *)
             std::vector<pbrt::Film,_std::allocator<pbrt::Film>_>::operator[]
                       ((vector<pbrt::Film,_std::allocator<pbrt::Film>_> *)(in_RDI + 0x68),
                        (size_type)local_180);
        ImageMetadata::ImageMetadata
                  ((ImageMetadata *)in_stack_fffffffffffffc10,
                   (ImageMetadata *)in_stack_fffffffffffffc08);
        Film::WriteImage(this_01,(ImageMetadata *)CONCAT17(uVar1,in_stack_fffffffffffffbb8),
                         (Float)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
        ImageMetadata::~ImageMetadata(in_stack_fffffffffffffbb0);
      }
      ImageMetadata::~ImageMetadata(in_stack_fffffffffffffbb0);
      local_180 = (Film *)((long)&(local_180->
                                  super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm,_pbrt::SpectralFilm>
                                  ).bits + 1);
    }
    std::vector<pbrt::Film,_std::allocator<pbrt::Film>_>::clear
              ((vector<pbrt::Film,_std::allocator<pbrt::Film>_> *)0x800aee);
  }
  return;
}

Assistant:

void BDPTIntegrator::Render() {
    // Allocate buffers for debug visualization
    if (visualizeStrategies || visualizeWeights) {
        const int bufferCount = (1 + maxDepth) * (6 + maxDepth) / 2;
        weightFilms.resize(bufferCount);
        for (int depth = 0; depth <= maxDepth; ++depth) {
            for (int s = 0; s <= depth + 2; ++s) {
                int t = depth + 2 - s;
                if (t == 0 || (s == 1 && t == 1))
                    continue;

                std::string filename =
                    StringPrintf("bdpt_d%02i_s%02i_t%02i.exr", depth, s, t);

                FilmBaseParameters p(
                    camera.GetFilm().FullResolution(),
                    Bounds2i(Point2i(0, 0), camera.GetFilm().FullResolution()),
                    new BoxFilter,  // FIXME: leaks
                    camera.GetFilm().Diagonal() * 1000, PixelSensor::CreateDefault(),
                    filename);
                weightFilms[BufferIndex(s, t)] = new RGBFilm(p, RGBColorSpace::sRGB);
            }
        }
    }

    RayIntegrator::Render();

    // Write buffers for debug visualization
    if (visualizeStrategies || visualizeWeights) {
        const Float invSampleCount = 1.0f / samplerPrototype.SamplesPerPixel();
        for (size_t i = 0; i < weightFilms.size(); ++i) {
            ImageMetadata metadata;
            if (weightFilms[i])
                weightFilms[i].WriteImage(metadata, invSampleCount);
        }
        weightFilms.clear();
    }
}